

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1FreePage(PgHdr1 *p)

{
  long in_RDI;
  PCache1 *pCache;
  void *p_00;
  
  p_00 = *(void **)(in_RDI + 0x20);
  if (*(short *)(in_RDI + 0x14) == 0) {
    pcache1Free(p_00);
  }
  else {
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)((long)p_00 + 0x48);
    *(long *)((long)p_00 + 0x48) = in_RDI;
  }
  **(int **)((long)p_00 + 8) = **(int **)((long)p_00 + 8) + -1;
  return;
}

Assistant:

static void pcache1FreePage(PgHdr1 *p){
  PCache1 *pCache;
  assert( p!=0 );
  pCache = p->pCache;
  assert( sqlite3_mutex_held(p->pCache->pGroup->mutex) );
  if( p->isBulkLocal ){
    p->pNext = pCache->pFree;
    pCache->pFree = p;
  }else{
    pcache1Free(p->page.pBuf);
  }
  (*pCache->pnPurgeable)--;
}